

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O1

int duckdb_hll::hex_digit_to_int(char c)

{
  undefined4 uVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = 0;
  uVar1 = (undefined4)CONCAT71(in_register_00000039,c);
  switch(uVar1) {
  case 0x31:
    return 1;
  case 0x32:
    return 2;
  case 0x33:
    return 3;
  case 0x34:
    return 4;
  case 0x35:
    return 5;
  case 0x36:
    return 6;
  case 0x37:
    return 7;
  case 0x38:
    return 8;
  case 0x39:
    return 9;
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
    break;
  case 0x41:
switchD_0120db85_caseD_41:
    return 10;
  case 0x42:
switchD_0120db85_caseD_42:
    return 0xb;
  case 0x43:
switchD_0120db85_caseD_43:
    return 0xc;
  case 0x44:
switchD_0120db85_caseD_44:
    return 0xd;
  case 0x45:
switchD_0120db85_caseD_45:
    return 0xe;
  case 0x46:
switchD_0120db85_caseD_46:
    iVar2 = 0xf;
    break;
  default:
    switch(uVar1) {
    case 0x61:
      goto switchD_0120db85_caseD_41;
    case 0x62:
      goto switchD_0120db85_caseD_42;
    case 99:
      goto switchD_0120db85_caseD_43;
    case 100:
      goto switchD_0120db85_caseD_44;
    case 0x65:
      goto switchD_0120db85_caseD_45;
    case 0x66:
      goto switchD_0120db85_caseD_46;
    default:
      break;
    }
  }
  return iVar2;
}

Assistant:

int hex_digit_to_int(char c) {
    switch(c) {
    case '0': return 0;
    case '1': return 1;
    case '2': return 2;
    case '3': return 3;
    case '4': return 4;
    case '5': return 5;
    case '6': return 6;
    case '7': return 7;
    case '8': return 8;
    case '9': return 9;
    case 'a': case 'A': return 10;
    case 'b': case 'B': return 11;
    case 'c': case 'C': return 12;
    case 'd': case 'D': return 13;
    case 'e': case 'E': return 14;
    case 'f': case 'F': return 15;
    default: return 0;
    }
}